

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O2

SquareMatrix<double> __thiscall qclab::qgates::RotationY<double>::matrix(RotationY<double> *this)

{
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<double> SVar1;
  
  dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)this,*(double *)(in_RSI + 0x10),-*(double *)(in_RSI + 0x18),
             *(double *)(in_RSI + 0x18),*(double *)(in_RSI + 0x10));
  SVar1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( this->cos() , -this->sin() ,
                                                  this->sin() ,  this->cos() ) ;
        }